

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.hpp
# Opt level: O1

void __thiscall optimization::inlineFunc::Rewriter::cast_block(Rewriter *this,BasicBlk *blk)

{
  _Rb_tree_header *p_Var1;
  set<int,_std::less<int>,_std::allocator<int>_> *this_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  mapped_type mVar5;
  int iVar6;
  JumpKind JVar7;
  MirFunction *pMVar8;
  _func_int **pp_Var9;
  undefined8 uVar10;
  Rewriter *this_01;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *this_02;
  Function *pFVar11;
  mapped_type *pmVar12;
  BasicBlk *pBVar13;
  char cVar14;
  uint uVar15;
  mapped_type *pmVar16;
  _Rb_tree_node_base *p_Var17;
  variant_alternative_t<1UL,_variant<VarId,_basic_string<char>_>_> *__rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  _func_int **pp_Var19;
  variant_alternative_t<0UL,_variant<VarId,_basic_string<char>_>_> *pvVar20;
  _Base_ptr p_Var21;
  uint32_t *puVar22;
  _Base_ptr p_Var23;
  pointer puVar24;
  uint32_t uVar25;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *tag;
  key_type *__k;
  Displayable DVar26;
  undefined **function;
  Inst *pIVar27;
  variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _val;
  int bb_true;
  mapped_type new_id;
  int bb_false;
  undefined1 local_350 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  pointer local_330;
  Rewriter *local_328;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_320;
  undefined1 local_318 [8];
  variant<int,_mir::inst::VarId> vStack_310;
  __index_type local_2f8;
  _func_int **local_2e8;
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  *local_2e0;
  Function *local_2d8;
  Displayable local_2d0;
  uint32_t local_2c4;
  anon_class_8_1_a78179b7_conflict local_2c0;
  undefined1 local_2b8 [8];
  undefined1 local_2b0 [16];
  _Variadic_union<int,_mir::inst::VarId> local_2a0;
  _Alloc_hider local_290;
  _Base_ptr local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  undefined1 local_270 [8];
  bool local_268;
  VarId local_220;
  undefined1 local_210;
  mapped_type *local_208;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_200;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [8];
  undefined1 auStack_1e0 [16];
  _Variadic_union<int,_mir::inst::VarId> _Stack_1d0;
  _Variadic_union<int,_mir::inst::VarId> *p_Stack_1c0;
  _Variadic_union<int,_mir::inst::VarId> *local_1b8;
  size_t sStack_1b0;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  local_1a8;
  Displayable local_190;
  JumpInstructionKind local_188;
  bool local_170;
  undefined8 local_168;
  JumpKind local_160;
  _func_int **local_150;
  _func_int **local_148;
  _func_int **local_140;
  _func_int **local_138;
  BasicBlk *local_130;
  _func_int **local_128;
  _func_int **local_120;
  pointer local_118;
  Value local_110;
  Value local_f0;
  Value local_d0;
  Value local_b0;
  Value local_90;
  Value local_70;
  Value local_50;
  
  local_200 = &this->label_cast_map;
  pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                      (local_200,&blk->id);
  local_1f8._12_4_ = *pmVar16;
  pMVar8 = this->func;
  local_1e8 = (undefined1  [8])&PTR_display_001f0478;
  auStack_1e0._0_4_ = local_1f8._12_4_;
  p_Stack_1c0 = &_Stack_1d0;
  _Stack_1d0._8_8_ = 0;
  auStack_1e0._8_8_ = 0;
  _Stack_1d0._0_8_ = 0;
  local_1a8.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sStack_1b0 = 0;
  local_1a8.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_190._vptr_Displayable = (_func_int **)&PTR_display_001f0438;
  local_188 = Undefined;
  local_170 = false;
  local_168._0_4_ = -1;
  local_168._4_4_ = -1;
  local_160 = Undefined;
  local_2b8._0_4_ = local_1f8._12_4_;
  local_1b8 = p_Stack_1c0;
  mir::inst::BasicBlk::BasicBlk((BasicBlk *)local_2b0,(BasicBlk *)local_1e8);
  std::
  _Rb_tree<int,std::pair<int_const,mir::inst::BasicBlk>,std::_Select1st<std::pair<int_const,mir::inst::BasicBlk>>,std::less<int>,std::allocator<std::pair<int_const,mir::inst::BasicBlk>>>
  ::_M_emplace_unique<std::pair<int,mir::inst::BasicBlk>>
            ((_Rb_tree<int,std::pair<int_const,mir::inst::BasicBlk>,std::_Select1st<std::pair<int_const,mir::inst::BasicBlk>>,std::less<int>,std::allocator<std::pair<int_const,mir::inst::BasicBlk>>>
              *)&pMVar8->basic_blks,(pair<int,_mir::inst::BasicBlk> *)local_2b8);
  local_2b0._0_8_ = &PTR_display_001f0478;
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::~vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             *)local_270);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &local_2a0._M_first);
  local_1e8 = (undefined1  [8])&PTR_display_001f0478;
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::~vector(&local_1a8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             (auStack_1e0 + 8));
  tag = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_1f8 + 0xc);
  local_328 = this;
  local_208 = std::
              map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              ::at(&this->func->basic_blks,(key_type *)tag->_M_local_buf);
  p_Var17 = (blk->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(blk->preceding)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var17 != p_Var1) {
    this_00 = &local_208->preceding;
    do {
      local_2b8._0_4_ = p_Var17[1]._M_color;
      pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                          (local_200,(key_type *)local_2b8);
      iVar4 = *pmVar16;
      if (iVar4 == local_328->sub_starttId) {
        iVar4 = local_328->cur_blkId;
      }
      local_1e8._0_4_ = iVar4;
      tag = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)this_00
                 ,(int *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1e8)->_M_local_buf);
      p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
    } while ((_Rb_tree_header *)p_Var17 != p_Var1);
  }
  puVar24 = (blk->inst).
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_118 = (blk->inst).
              super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_130 = blk;
  if (puVar24 != local_118) {
    local_320 = &local_328->var_cast_map;
    local_2e0 = (vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                 *)&local_208->inst;
    function = &PTR_display_001f0018;
    local_120 = (_func_int **)&PTR_display_001f0078;
    local_148 = (_func_int **)&PTR_display_001f0198;
    local_138 = (_func_int **)&PTR_display_001f02b8;
    local_140 = (_func_int **)&PTR_display_001f0378;
    local_128 = (_func_int **)&PTR_display_001f0138;
    local_150 = (_func_int **)&PTR_display_001f03d8;
    local_2d8 = (Function *)&PTR_display_001f0018;
    local_2e8 = (_func_int **)&PTR_display_001f01f8;
    local_2d0._vptr_Displayable = (_func_int **)&PTR_display_001effc8;
    do {
      uVar15 = (*(((puVar24->_M_t).
                   super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                   super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->super_Displayable)
                 ._vptr_Displayable[1])();
      DVar26._vptr_Displayable = local_2d0._vptr_Displayable;
      pp_Var19 = local_2e8;
      this_02 = local_320;
      if (7 < uVar15) {
        local_2c0.__lhs =
             (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)
             ((ulong)local_2c0.__lhs & 0xffffffffffffff00);
        AixLog::operator<<((ostream *)&local_2c0,(Severity *)&tag->_M_allocated_capacity);
        local_1e8 = (undefined1  [8])&PTR__Tag_001edee0;
        auStack_1e0._0_8_ = &_Stack_1d0;
        auStack_1e0._8_8_ = 0;
        _Stack_1d0._0_8_ = _Stack_1d0._0_8_ & 0xffffffffffffff00;
        p_Stack_1c0 = (_Variadic_union<int,_mir::inst::VarId> *)CONCAT71(p_Stack_1c0._1_7_,1);
        AixLog::operator<<((ostream *)local_1e8,(Tag *)tag);
        local_220._8_8_ = std::chrono::_V2::system_clock::now();
        local_220.super_Displayable._vptr_Displayable = (_func_int **)&PTR__Timestamp_001edeb0;
        local_210 = 0;
        AixLog::operator<<((ostream *)&local_220,(Timestamp *)tag);
        local_318 = (undefined1  [8])
                    ((long)&vStack_310.super__Variant_base<int,_mir::inst::VarId>.
                            super__Move_assign_alias<int,_mir::inst::VarId>.
                            super__Copy_assign_alias<int,_mir::inst::VarId>.
                            super__Move_ctor_alias<int,_mir::inst::VarId>.
                            super__Copy_ctor_alias<int,_mir::inst::VarId>.
                            super__Variant_storage_alias<int,_mir::inst::VarId>._M_u + 8);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"cast_block","");
        local_350._0_8_ = local_350 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_350,
                   "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/inline.hpp"
                   ,"");
        local_2b8 = (undefined1  [8])&PTR__Function_001edf10;
        DVar26._vptr_Displayable =
             (_func_int **)
             ((long)&vStack_310.super__Variant_base<int,_mir::inst::VarId>.
                     super__Move_assign_alias<int,_mir::inst::VarId>.
                     super__Copy_assign_alias<int,_mir::inst::VarId>.
                     super__Move_ctor_alias<int,_mir::inst::VarId>.
                     super__Copy_ctor_alias<int,_mir::inst::VarId>.
                     super__Variant_storage_alias<int,_mir::inst::VarId>._M_u + 8);
        local_2b0._0_8_ = &local_2a0;
        if (local_318 != (undefined1  [8])DVar26._vptr_Displayable) {
          local_2b0._0_8_ = local_318;
        }
        local_2a0._0_8_ =
             vStack_310.super__Variant_base<int,_mir::inst::VarId>.
             super__Move_assign_alias<int,_mir::inst::VarId>.
             super__Copy_assign_alias<int,_mir::inst::VarId>.
             super__Move_ctor_alias<int,_mir::inst::VarId>.
             super__Copy_ctor_alias<int,_mir::inst::VarId>.
             super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_;
        local_2b0._8_8_ =
             vStack_310.super__Variant_base<int,_mir::inst::VarId>.
             super__Move_assign_alias<int,_mir::inst::VarId>.
             super__Copy_assign_alias<int,_mir::inst::VarId>.
             super__Move_ctor_alias<int,_mir::inst::VarId>.
             super__Copy_ctor_alias<int,_mir::inst::VarId>.
             super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_;
        vStack_310.super__Variant_base<int,_mir::inst::VarId>.
        super__Move_assign_alias<int,_mir::inst::VarId>.
        super__Copy_assign_alias<int,_mir::inst::VarId>.
        super__Move_ctor_alias<int,_mir::inst::VarId>.super__Copy_ctor_alias<int,_mir::inst::VarId>.
        super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ = 0;
        vStack_310.super__Variant_base<int,_mir::inst::VarId>.
        super__Move_assign_alias<int,_mir::inst::VarId>.
        super__Copy_assign_alias<int,_mir::inst::VarId>.
        super__Move_ctor_alias<int,_mir::inst::VarId>.super__Copy_ctor_alias<int,_mir::inst::VarId>.
        super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ =
             vStack_310.super__Variant_base<int,_mir::inst::VarId>.
             super__Move_assign_alias<int,_mir::inst::VarId>.
             super__Copy_assign_alias<int,_mir::inst::VarId>.
             super__Move_ctor_alias<int,_mir::inst::VarId>.
             super__Copy_ctor_alias<int,_mir::inst::VarId>.
             super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ & 0xffffffffffffff00;
        local_290._M_p = (pointer)&local_280;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_350 + 0x10)) {
          local_290._M_p = (pointer)local_350._0_8_;
        }
        local_280._M_allocated_capacity._1_7_ = local_340._M_allocated_capacity._1_7_;
        local_280._M_local_buf[0] = local_340._M_local_buf[0];
        local_288 = (_Base_ptr)local_350._8_8_;
        local_350._8_8_ = (_Base_ptr)0x0;
        local_340._M_local_buf[0] = 0;
        local_270 = (undefined1  [8])0xc5;
        local_268 = false;
        local_350._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_350 + 0x10);
        local_318 = (undefined1  [8])DVar26._vptr_Displayable;
        AixLog::operator<<((ostream *)local_2b8,(Function *)function);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"error!",6);
        cVar14 = std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
        tag = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(ulong)(uint)(int)cVar14;
        std::ostream::put(-0x80);
        std::ostream::flush();
        AixLog::Function::~Function((Function *)local_2b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_350 + 0x10)) {
          tag = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(CONCAT71(local_340._M_allocated_capacity._1_7_,local_340._M_local_buf[0]) + 1);
          operator_delete((void *)local_350._0_8_,(ulong)tag);
        }
        if (local_318 !=
            (undefined1  [8])
            ((long)&vStack_310.super__Variant_base<int,_mir::inst::VarId>.
                    super__Move_assign_alias<int,_mir::inst::VarId>.
                    super__Copy_assign_alias<int,_mir::inst::VarId>.
                    super__Move_ctor_alias<int,_mir::inst::VarId>.
                    super__Copy_ctor_alias<int,_mir::inst::VarId>.
                    super__Variant_storage_alias<int,_mir::inst::VarId>._M_u + 8)) {
          tag = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(vStack_310.super__Variant_base<int,_mir::inst::VarId>.
                    super__Move_assign_alias<int,_mir::inst::VarId>.
                    super__Copy_assign_alias<int,_mir::inst::VarId>.
                    super__Move_ctor_alias<int,_mir::inst::VarId>.
                    super__Copy_ctor_alias<int,_mir::inst::VarId>.
                    super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ + 1);
          operator_delete((void *)local_318,(ulong)tag);
        }
        local_1e8 = (undefined1  [8])&PTR__Tag_001edee0;
        if ((_Variadic_union<int,_mir::inst::VarId> *)auStack_1e0._0_8_ == &_Stack_1d0)
        goto LAB_00126055;
        tag = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(_Stack_1d0._0_8_ + 1);
        DVar26._vptr_Displayable = (_func_int **)auStack_1e0._0_8_;
        goto LAB_00126050;
      }
      pIVar27 = (puVar24->_M_t).
                super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
      switch(uVar15) {
      case 0:
        if ((pIVar27->super_Displayable)._vptr_Displayable != (_func_int **)function) {
          pIVar27 = (Inst *)0x0;
        }
        local_2b8._0_4_ = (pIVar27->dest).id;
        local_330 = puVar24;
        puVar22 = (uint32_t *)
                  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  at(local_320,(key_type *)local_2b8);
        local_2c4 = *puVar22;
        local_b0._24_1_ = *(undefined1 *)&pIVar27[2].super_Displayable._vptr_Displayable;
        local_2b8 = (undefined1  [8])&local_b0.field_0x8;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)local_b0._24_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_2b8,
                   (variant<int,_mir::inst::VarId> *)&pIVar27[1].dest);
        DVar26._vptr_Displayable = local_2d0._vptr_Displayable;
        local_b0.super_Displayable._vptr_Displayable = local_2d0._vptr_Displayable;
        local_b0._25_2_ = *(undefined2 *)((long)&pIVar27[2].super_Displayable._vptr_Displayable + 1)
        ;
        cast_value((Value *)local_1e8,local_328,&local_b0);
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)operator_new(0x38);
        pFVar11 = local_2d8;
        local_2a0._M_rest._0_1_ = _Stack_1d0._M_rest._0_1_;
        local_318 = (undefined1  [8])local_2b0;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)_Stack_1d0._M_rest._0_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_318,
                   (variant<int,_mir::inst::VarId> *)auStack_1e0);
        local_2b8 = (undefined1  [8])DVar26._vptr_Displayable;
        local_2a0._M_first._M_storage._1_2_ = _Stack_1d0._M_first._M_storage._1_2_;
        (((VarId *)(paVar18->_M_local_buf + 8))->super_Displayable)._vptr_Displayable =
             (_func_int **)&PTR_display_001ee058;
        *(uint32_t *)(paVar18 + 1) = local_2c4;
        paVar18->_M_allocated_capacity = (size_type)pFVar11;
        local_318 = (undefined1  [8])(paVar18 + 2);
        paVar18[3]._M_local_buf[0] = -1;
        paVar18[3]._M_local_buf[0] = local_2a0._M_rest._0_1_;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)local_2a0._M_rest._0_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_318,
                   (variant<int,_mir::inst::VarId> *)local_2b0);
        (((Value *)((long)paVar18 + 0x18))->super_Displayable)._vptr_Displayable =
             DVar26._vptr_Displayable;
        *(undefined2 *)((long)paVar18 + 0x31) = local_2a0._M_first._M_storage._1_2_;
        tag = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_350;
        local_350._0_8_ = paVar18;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  (local_2e0,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                   &tag->_M_allocated_capacity);
        puVar24 = local_330;
        goto joined_r0x00125978;
      case 1:
        if ((pIVar27->super_Displayable)._vptr_Displayable != local_120) {
          pIVar27 = (Inst *)0x0;
        }
        local_2b8._0_4_ = (pIVar27->dest).id;
        pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  at(local_320,(key_type *)local_2b8);
        local_330 = (pointer)CONCAT44(local_330._4_4_,*pmVar16);
        local_70._24_1_ = *(undefined1 *)&pIVar27[2].super_Displayable._vptr_Displayable;
        local_2b8 = (undefined1  [8])&local_70.field_0x8;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)local_70._24_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_2b8,
                   (variant<int,_mir::inst::VarId> *)&pIVar27[1].dest);
        DVar26._vptr_Displayable = local_2d0._vptr_Displayable;
        this_01 = local_328;
        local_70.super_Displayable._vptr_Displayable = local_2d0._vptr_Displayable;
        local_70._25_2_ = *(undefined2 *)((long)&pIVar27[2].super_Displayable._vptr_Displayable + 1)
        ;
        cast_value((Value *)local_318,local_328,&local_70);
        local_90._24_1_ = *(undefined1 *)&pIVar27[3].dest.super_Displayable._vptr_Displayable;
        local_2b8 = (undefined1  [8])&local_90.field_0x8;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)local_90._24_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_2b8,
                   (variant<int,_mir::inst::VarId> *)&pIVar27[2].dest.id);
        local_90.super_Displayable._vptr_Displayable = DVar26._vptr_Displayable;
        local_90._25_2_ =
             *(undefined2 *)((long)&pIVar27[3].dest.super_Displayable._vptr_Displayable + 1);
        cast_value((Value *)local_350,this_01,&local_90);
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)operator_new(0x60);
        local_220.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
        local_220.id = (uint32_t)local_330;
        local_2a0._M_rest._0_1_ =
             vStack_310.super__Variant_base<int,_mir::inst::VarId>.
             super__Move_assign_alias<int,_mir::inst::VarId>.
             super__Copy_assign_alias<int,_mir::inst::VarId>.
             super__Move_ctor_alias<int,_mir::inst::VarId>.
             super__Copy_ctor_alias<int,_mir::inst::VarId>.
             super__Variant_storage_alias<int,_mir::inst::VarId>._M_index;
        local_2c0.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)local_2b0;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr
          [(long)(char)vStack_310.super__Variant_base<int,_mir::inst::VarId>.
                       super__Move_assign_alias<int,_mir::inst::VarId>.
                       super__Copy_assign_alias<int,_mir::inst::VarId>.
                       super__Move_ctor_alias<int,_mir::inst::VarId>.
                       super__Copy_ctor_alias<int,_mir::inst::VarId>.
                       super__Variant_storage_alias<int,_mir::inst::VarId>._M_index + 1]._M_data)
                  (&local_2c0,&vStack_310);
        local_2b8 = (undefined1  [8])DVar26._vptr_Displayable;
        local_2a0._M_first._M_storage._1_2_ =
             vStack_310.super__Variant_base<int,_mir::inst::VarId>.
             super__Move_assign_alias<int,_mir::inst::VarId>.
             super__Copy_assign_alias<int,_mir::inst::VarId>.
             super__Move_ctor_alias<int,_mir::inst::VarId>.
             super__Copy_ctor_alias<int,_mir::inst::VarId>.
             super__Variant_storage_alias<int,_mir::inst::VarId>._17_2_;
        _Stack_1d0._M_rest._0_1_ = local_340._M_local_buf[8];
        local_2c0.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)auStack_1e0;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)local_340._M_local_buf[8] + 1]._M_data)
                  (&local_2c0,(variant<int,_mir::inst::VarId> *)(local_350 + 8));
        local_1e8 = (undefined1  [8])DVar26._vptr_Displayable;
        _Stack_1d0._M_first._M_storage._1_2_ = local_340._9_2_;
        mir::inst::OpInst::OpInst
                  ((OpInst *)paVar18,&local_220,(Value *)local_2b8,(Value *)local_1e8,
                   pIVar27[3].dest.id);
        tag = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8;
        local_1f8._0_8_ = paVar18;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  (local_2e0,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                   &tag->_M_allocated_capacity);
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._0_8_;
        function = (undefined **)local_2d8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._0_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) break;
        goto LAB_0012597e;
      case 2:
        if ((pIVar27->super_Displayable)._vptr_Displayable != local_148) {
          pIVar27 = (Inst *)0x0;
        }
        std::__detail::__variant::
        _Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_1e8,
                          (_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)(pIVar27 + 1));
        local_318 = (undefined1  [8])&PTR_display_001ee058;
        vStack_310.super__Variant_base<int,_mir::inst::VarId>.
        super__Move_assign_alias<int,_mir::inst::VarId>.
        super__Copy_assign_alias<int,_mir::inst::VarId>.
        super__Move_ctor_alias<int,_mir::inst::VarId>.super__Copy_ctor_alias<int,_mir::inst::VarId>.
        super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._M_first._M_storage =
             (_Uninitialized<int,_true>)0xffffffff;
        local_2f8 = '\0';
        if (_Stack_1d0._8_1_ == '\0') {
          pvVar20 = std::get<0ul,mir::inst::VarId,std::__cxx11::string>
                              ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_1e8);
          local_350._0_4_ = pvVar20->id;
          pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::at(local_320,(key_type *)local_350);
          local_2b8 = (undefined1  [8])&PTR_display_001ee058;
          local_2b0._0_4_ = *pmVar16;
          std::variant<mir::inst::VarId,std::__cxx11::string>::operator=
                    ((variant<mir::inst::VarId,std::__cxx11::string> *)local_318,(VarId *)local_2b8)
          ;
        }
        else {
          __rhs = std::get<1ul,mir::inst::VarId,std::__cxx11::string>
                            ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_1e8);
          std::variant<mir::inst::VarId,std::__cxx11::string>::operator=
                    ((variant<mir::inst::VarId,std::__cxx11::string> *)local_318,__rhs);
        }
        local_2b8._0_4_ = (pIVar27->dest).id;
        pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  at(local_320,(key_type *)local_2b8);
        mVar5 = *pmVar16;
        pp_Var19 = (_func_int **)operator_new(0x40);
        std::__detail::__variant::
        _Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_2b8,
                          (_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_318);
        pp_Var19[1] = (_func_int *)&PTR_display_001ee058;
        *(mapped_type *)(pp_Var19 + 2) = mVar5;
        *pp_Var19 = (_func_int *)local_148;
        std::__detail::__variant::
        _Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)(pp_Var19 + 3),
                          (_Copy_ctor_base<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_2b8);
        local_220.super_Displayable._vptr_Displayable = pp_Var19;
        std::__detail::__variant::
        _Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Variant_storage((_Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_2b8);
        local_350._0_8_ = local_220.super_Displayable._vptr_Displayable;
        local_220.super_Displayable._vptr_Displayable = (_func_int **)0x0;
        tag = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_350;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  (local_2e0,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                   &tag->_M_allocated_capacity);
        if ((long *)local_350._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_350._0_8_ + 0x28))();
        }
        local_350._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        std::unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_>::~unique_ptr
                  ((unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_> *)
                   &local_220);
        std::__detail::__variant::
        _Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Variant_storage((_Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_318);
        std::__detail::__variant::
        _Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Variant_storage((_Variant_storage<false,_mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_1e8);
        break;
      case 3:
        if ((pIVar27->super_Displayable)._vptr_Displayable != local_2e8) {
          pIVar27 = (Inst *)0x0;
        }
        local_d0._24_1_ = *(undefined1 *)&pIVar27[2].super_Displayable._vptr_Displayable;
        local_2b8 = (undefined1  [8])&local_d0.field_0x8;
        local_330 = puVar24;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)local_d0._24_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_2b8,
                   (variant<int,_mir::inst::VarId> *)&pIVar27[1].dest);
        DVar26._vptr_Displayable = local_2d0._vptr_Displayable;
        local_d0.super_Displayable._vptr_Displayable = local_2d0._vptr_Displayable;
        local_d0._25_2_ = *(undefined2 *)((long)&pIVar27[2].super_Displayable._vptr_Displayable + 1)
        ;
        cast_value((Value *)local_1e8,local_328,&local_d0);
        local_2b8._0_4_ = (pIVar27->dest).id;
        puVar22 = (uint32_t *)
                  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  at(local_320,(key_type *)local_2b8);
        uVar25 = *puVar22;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)operator_new(0x38);
        local_2a0._M_rest._0_1_ = _Stack_1d0._M_rest._0_1_;
        local_318 = (undefined1  [8])local_2b0;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)_Stack_1d0._M_rest._0_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_318,
                   (variant<int,_mir::inst::VarId> *)auStack_1e0);
        local_2b8 = (undefined1  [8])DVar26._vptr_Displayable;
        local_2a0._M_first._M_storage._1_2_ = _Stack_1d0._M_first._M_storage._1_2_;
        (((VarId *)(paVar18->_M_local_buf + 8))->super_Displayable)._vptr_Displayable =
             (_func_int **)&PTR_display_001ee058;
        *(uint32_t *)(paVar18 + 1) = uVar25;
        paVar18->_M_allocated_capacity = (size_type)pp_Var19;
        local_318 = (undefined1  [8])(paVar18 + 2);
        paVar18[3]._M_local_buf[0] = -1;
        paVar18[3]._M_local_buf[0] = local_2a0._M_rest._0_1_;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)local_2a0._M_rest._0_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_318,
                   (variant<int,_mir::inst::VarId> *)local_2b0);
        (((Value *)((long)paVar18 + 0x18))->super_Displayable)._vptr_Displayable =
             DVar26._vptr_Displayable;
        *(undefined2 *)((long)paVar18 + 0x31) = local_2a0._M_first._M_storage._1_2_;
        tag = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_350;
        local_350._0_8_ = paVar18;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  (local_2e0,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                   &tag->_M_allocated_capacity);
        puVar24 = local_330;
        goto joined_r0x00125978;
      case 4:
        if ((pIVar27->super_Displayable)._vptr_Displayable != local_138) {
          pIVar27 = (Inst *)0x0;
        }
        local_f0._24_1_ = *(undefined1 *)&pIVar27[2].super_Displayable._vptr_Displayable;
        local_2b8 = (undefined1  [8])&local_f0.field_0x8;
        local_330 = puVar24;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)local_f0._24_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_2b8,
                   (variant<int,_mir::inst::VarId> *)&pIVar27[1].dest);
        local_f0.super_Displayable._vptr_Displayable = DVar26._vptr_Displayable;
        local_f0._25_2_ = *(undefined2 *)((long)&pIVar27[2].super_Displayable._vptr_Displayable + 1)
        ;
        cast_value((Value *)local_1e8,local_328,&local_f0);
        local_2b8._0_4_ = (pIVar27->dest).id;
        puVar22 = (uint32_t *)
                  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  at(local_320,(key_type *)local_2b8);
        uVar25 = *puVar22;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)operator_new(0x38);
        local_2a0._M_rest._0_1_ = _Stack_1d0._M_rest._0_1_;
        local_318 = (undefined1  [8])local_2b0;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)_Stack_1d0._M_rest._0_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_318,
                   (variant<int,_mir::inst::VarId> *)auStack_1e0);
        local_2b8 = (undefined1  [8])DVar26._vptr_Displayable;
        local_2a0._M_first._M_storage._1_2_ = _Stack_1d0._M_first._M_storage._1_2_;
        (((VarId *)(paVar18->_M_local_buf + 8))->super_Displayable)._vptr_Displayable =
             (_func_int **)&PTR_display_001ee058;
        *(uint32_t *)(paVar18 + 1) = uVar25;
        paVar18->_M_allocated_capacity = (size_type)local_138;
        local_318 = (undefined1  [8])(paVar18 + 2);
        paVar18[3]._M_local_buf[0] = -1;
        paVar18[3]._M_local_buf[0] = local_2a0._M_rest._0_1_;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)local_2a0._M_rest._0_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_318,
                   (variant<int,_mir::inst::VarId> *)local_2b0);
        (((Value *)((long)paVar18 + 0x18))->super_Displayable)._vptr_Displayable =
             DVar26._vptr_Displayable;
        *(undefined2 *)((long)paVar18 + 0x31) = local_2a0._M_first._M_storage._1_2_;
        tag = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_350;
        local_350._0_8_ = paVar18;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  (local_2e0,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                   &tag->_M_allocated_capacity);
        puVar24 = local_330;
        function = (undefined **)local_2d8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_350._0_8_ + 0x28))();
          function = (undefined **)local_2d8;
        }
        break;
      case 5:
        if ((pIVar27->super_Displayable)._vptr_Displayable != local_140) {
          pIVar27 = (Inst *)0x0;
        }
        local_2b8._0_4_ = (pIVar27->dest).id;
        pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  at(local_320,(key_type *)local_2b8);
        local_330 = (pointer)CONCAT44(local_330._4_4_,*pmVar16);
        local_2b8._0_4_ = *(int *)&pIVar27[1].dest.super_Displayable._vptr_Displayable;
        puVar22 = (uint32_t *)
                  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  at(this_02,(key_type *)local_2b8);
        local_2c4 = *puVar22;
        local_110._24_1_ = SUB41(pIVar27[2].dest.id,0);
        local_2b8 = (undefined1  [8])&local_110.field_0x8;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)local_110._24_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_2b8,
                   (variant<int,_mir::inst::VarId> *)(pIVar27 + 2));
        DVar26._vptr_Displayable = local_2d0._vptr_Displayable;
        local_110.super_Displayable._vptr_Displayable = local_2d0._vptr_Displayable;
        local_110._25_2_ = *(undefined2 *)((long)&pIVar27[2].dest.id + 1);
        cast_value((Value *)local_1e8,local_328,&local_110);
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)operator_new(0x48);
        local_2a0._M_rest._0_1_ = _Stack_1d0._M_rest._0_1_;
        local_318 = (undefined1  [8])local_2b0;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)_Stack_1d0._M_rest._0_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_318,
                   (variant<int,_mir::inst::VarId> *)auStack_1e0);
        local_2b8 = (undefined1  [8])DVar26._vptr_Displayable;
        local_2a0._M_first._M_storage._1_2_ = _Stack_1d0._M_first._M_storage._1_2_;
        (((VarId *)(paVar18->_M_local_buf + 8))->super_Displayable)._vptr_Displayable =
             (_func_int **)&PTR_display_001ee058;
        *(uint32_t *)(paVar18 + 1) = (uint32_t)local_330;
        paVar18->_M_allocated_capacity = (size_type)local_140;
        (((Value *)((long)paVar18 + 0x18))->super_Displayable)._vptr_Displayable =
             (_func_int **)&PTR_display_001ee058;
        *(uint32_t *)(paVar18 + 2) = local_2c4;
        local_318 = (undefined1  [8])(paVar18 + 3);
        paVar18[4]._M_local_buf[0] = -1;
        paVar18[4]._M_local_buf[0] = local_2a0._M_rest._0_1_;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
          ::_S_vtable._M_arr[(long)(char)local_2a0._M_rest._0_1_ + 1]._M_data)
                  ((anon_class_8_1_a78179b7_conflict *)local_318,
                   (variant<int,_mir::inst::VarId> *)local_2b0);
        *(_func_int ***)((long)paVar18 + 0x28) = DVar26._vptr_Displayable;
        *(undefined2 *)((long)paVar18 + 0x41) = local_2a0._M_first._M_storage._1_2_;
        tag = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_350;
        local_350._0_8_ = paVar18;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  (local_2e0,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                   &tag->_M_allocated_capacity);
joined_r0x00125978:
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_350._0_8_;
        function = (undefined **)local_2d8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
LAB_0012597e:
          function = (undefined **)local_2d8;
          (**(code **)(paVar18->_M_allocated_capacity + 0x28))();
        }
        break;
      case 6:
        if ((pIVar27->super_Displayable)._vptr_Displayable != local_128) {
          pIVar27 = (Inst *)0x0;
        }
        vStack_310.super__Variant_base<int,_mir::inst::VarId>.
        super__Move_assign_alias<int,_mir::inst::VarId>.
        super__Copy_assign_alias<int,_mir::inst::VarId>.
        super__Move_ctor_alias<int,_mir::inst::VarId>.super__Copy_ctor_alias<int,_mir::inst::VarId>.
        super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_ = 0;
        local_318 = (undefined1  [8])0x0;
        vStack_310.super__Variant_base<int,_mir::inst::VarId>.
        super__Move_assign_alias<int,_mir::inst::VarId>.
        super__Copy_assign_alias<int,_mir::inst::VarId>.
        super__Move_ctor_alias<int,_mir::inst::VarId>.super__Copy_ctor_alias<int,_mir::inst::VarId>.
        super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._0_8_ = 0;
        pp_Var9 = *(_func_int ***)&pIVar27[2].dest.id;
        local_330 = puVar24;
        for (pp_Var19 = pIVar27[2].dest.super_Displayable._vptr_Displayable; pp_Var19 != pp_Var9;
            pp_Var19 = pp_Var19 + 4) {
          local_2a0._1_7_ = (int7)((ulong)local_2a0._0_8_ >> 8);
          local_2a0._M_rest._0_1_ = *(undefined1 *)(pp_Var19 + 3);
          local_1e8 = (undefined1  [8])local_2b0;
          (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
            ::_S_vtable._M_arr[(long)*(char *)(pp_Var19 + 3) + 1]._M_data)
                    ((anon_class_8_1_a78179b7_conflict *)local_1e8,
                     (variant<int,_mir::inst::VarId> *)(pp_Var19 + 1));
          local_2b8 = (undefined1  [8])local_2d0._vptr_Displayable;
          local_2a0._M_first._M_storage._1_2_ = *(undefined2 *)((long)pp_Var19 + 0x19);
          local_50._24_1_ = local_2a0._M_rest._0_1_;
          local_350._0_8_ = &local_50.field_0x8;
          (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
            ::_S_vtable._M_arr[(long)(char)local_2a0._M_rest._0_1_ + 1]._M_data)
                    ((anon_class_8_1_a78179b7_conflict *)local_350,
                     (variant<int,_mir::inst::VarId> *)local_2b0);
          uVar10 = local_2a0._0_8_;
          local_50.super_Displayable._vptr_Displayable = local_2d0._vptr_Displayable;
          local_50.shift = local_2a0._M_first._M_storage._1_1_;
          local_50.shift_amount = local_2a0._M_first._M_storage._2_1_;
          local_2a0._0_8_ = uVar10;
          cast_value((Value *)local_1e8,local_328,&local_50);
          std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::
          emplace_back<mir::inst::Value>
                    ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)local_318,
                     (Value *)local_1e8);
        }
        local_220.super_Displayable._vptr_Displayable._0_4_ = (pIVar27->dest).id;
        pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  at(local_320,(key_type *)&local_220);
        local_2b8 = (undefined1  [8])&PTR_display_001ee058;
        local_2b0._0_4_ = *pmVar16;
        std::
        make_unique<mir::inst::CallInst,mir::inst::VarId,std::__cxx11::string&,std::vector<mir::inst::Value,std::allocator<mir::inst::Value>>&>
                  ((VarId *)local_350,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                   (vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)(pIVar27 + 1));
        local_1e8 = (undefined1  [8])local_350._0_8_;
        local_350._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        tag = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  (local_2e0,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                   &tag->_M_allocated_capacity);
        function = (undefined **)local_2d8;
        puVar24 = local_330;
        if (local_1e8 != (undefined1  [8])0x0) {
          (**(code **)(*(_func_int **)local_1e8 + 0x28))();
        }
        local_1e8 = (undefined1  [8])0x0;
        std::unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_>::~unique_ptr
                  ((unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_> *)
                   local_350);
        DVar26._vptr_Displayable = (_func_int **)local_318;
        uVar10 = vStack_310.super__Variant_base<int,_mir::inst::VarId>.
                 super__Move_assign_alias<int,_mir::inst::VarId>.
                 super__Copy_assign_alias<int,_mir::inst::VarId>.
                 super__Move_ctor_alias<int,_mir::inst::VarId>.
                 super__Copy_ctor_alias<int,_mir::inst::VarId>.
                 super__Variant_storage_alias<int,_mir::inst::VarId>._M_u._8_8_;
        goto joined_r0x00125cc4;
      case 7:
        if ((pIVar27->super_Displayable)._vptr_Displayable != local_150) {
          pIVar27 = (Inst *)0x0;
        }
        auStack_1e0._8_8_ = 0;
        local_1e8 = (undefined1  [8])0x0;
        auStack_1e0._0_8_ = (_Variadic_union<int,_mir::inst::VarId> *)0x0;
        pp_Var9 = pIVar27[2].super_Displayable._vptr_Displayable;
        for (pp_Var19 = *(_func_int ***)&pIVar27[1].dest.id; pp_Var19 != pp_Var9;
            pp_Var19 = pp_Var19 + 2) {
          local_318._0_4_ = *(undefined4 *)(pp_Var19 + 1);
          pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::at(local_320,(key_type *)local_318);
          local_2b8 = (undefined1  [8])&PTR_display_001ee058;
          local_2b0._0_4_ = *pmVar16;
          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
          emplace_back<mir::inst::VarId>
                    ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_1e8,
                     (VarId *)local_2b8);
        }
        local_2b8._0_4_ = (pIVar27->dest).id;
        pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  at(local_320,(key_type *)local_2b8);
        mVar5 = *pmVar16;
        pp_Var19 = (_func_int **)operator_new(0x40);
        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_2b8,
                   (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_1e8);
        function = (undefined **)local_2d8;
        pp_Var19[1] = (_func_int *)&PTR_display_001ee058;
        *(mapped_type *)(pp_Var19 + 2) = mVar5;
        *pp_Var19 = (_func_int *)local_150;
        pp_Var19[3] = (_func_int *)&PTR_display_001ee058;
        *(mapped_type *)(pp_Var19 + 4) = mVar5;
        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)(pp_Var19 + 5),
                   (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_2b8);
        local_350._0_8_ = pp_Var19;
        if (local_2b8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_2b8,local_2b0._8_8_ - (long)local_2b8);
        }
        local_318 = (undefined1  [8])local_350._0_8_;
        local_350._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  (local_2e0,
                   (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)local_318);
        if (local_318 != (undefined1  [8])0x0) {
          (**(code **)(*(_func_int **)local_318 + 0x28))();
        }
        local_318 = (undefined1  [8])0x0;
        tag = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_350._0_8_;
        DVar26._vptr_Displayable = (_func_int **)local_1e8;
        uVar10 = auStack_1e0._8_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::default_delete<mir::inst::PhiInst>::operator()
                    ((default_delete<mir::inst::PhiInst> *)local_350,(PhiInst *)local_350._0_8_);
          DVar26._vptr_Displayable = (_func_int **)local_1e8;
          uVar10 = auStack_1e0._8_8_;
        }
joined_r0x00125cc4:
        if ((_Variadic_union<int,_mir::inst::VarId> *)DVar26._vptr_Displayable !=
            (_Variadic_union<int,_mir::inst::VarId> *)0x0) {
          tag = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(uVar10 - (long)DVar26._vptr_Displayable);
LAB_00126050:
          operator_delete(DVar26._vptr_Displayable,(ulong)tag);
        }
      }
LAB_00126055:
      puVar24 = puVar24 + 1;
    } while (puVar24 != local_118);
  }
  pBVar13 = local_130;
  pmVar12 = local_208;
  iVar4 = (local_130->jump).bb_true;
  iVar6 = (local_130->jump).bb_false;
  p_Var1 = &(local_328->label_cast_map)._M_t._M_impl.super__Rb_tree_header;
  p_Var23 = (local_328->label_cast_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var21 = &p_Var1->_M_header;
  for (; p_Var23 != (_Base_ptr)0x0; p_Var23 = (&p_Var23->_M_left)[(long)tag]) {
    tag = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(ulong)((int)p_Var23[1]._M_color < iVar4);
    if (iVar4 <= (int)p_Var23[1]._M_color) {
      p_Var21 = p_Var23;
    }
  }
  p_Var23 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var21 != p_Var1) &&
     (p_Var23 = p_Var21, iVar4 < (int)p_Var21[1]._M_color)) {
    p_Var23 = &p_Var1->_M_header;
  }
  local_2b8._0_4_ = iVar4;
  local_1e8._0_4_ = iVar6;
  if ((_Rb_tree_header *)p_Var23 != p_Var1) {
    tag = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8;
    pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                        (local_200,(key_type *)tag->_M_local_buf);
    local_2b8._0_4_ = *pmVar16;
  }
  p_Var23 = (local_328->label_cast_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var21 = &p_Var1->_M_header;
  for (; p_Var23 != (_Base_ptr)0x0; p_Var23 = (&p_Var23->_M_left)[(long)tag]) {
    tag = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(ulong)((int)p_Var23[1]._M_color < (int)local_1e8._0_4_);
    if ((int)local_1e8._0_4_ <= (int)p_Var23[1]._M_color) {
      p_Var21 = p_Var23;
    }
  }
  uVar25 = (uint32_t)tag;
  p_Var23 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var21 != p_Var1) &&
     (p_Var23 = p_Var21, (int)local_1e8._0_4_ < (int)p_Var21[1]._M_color)) {
    p_Var23 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var23 != p_Var1) {
    __k = (key_type *)local_1e8;
    pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                        (local_200,__k);
    uVar25 = (uint32_t)__k;
    local_1e8._0_4_ = *pmVar16;
  }
  bVar2 = (pBVar13->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>.
          _M_payload.super__Optional_payload_base<mir::inst::VarId>._M_engaged;
  if (bVar2 == true) {
    local_318._0_4_ =
         (pBVar13->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload
         .super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id;
    puVar22 = (uint32_t *)
              std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                        (&local_328->var_cast_map,(key_type *)local_318);
    uVar25 = *puVar22;
  }
  JVar7 = (pBVar13->jump).jump_kind;
  (pmVar12->jump).kind = (pBVar13->jump).kind;
  bVar3 = (pmVar12->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>.
          _M_payload.super__Optional_payload_base<mir::inst::VarId>._M_engaged;
  if ((bVar3 == true) && (bVar2 != false)) {
    (pmVar12->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id = uVar25;
  }
  else if (bVar2 == false) {
    if (bVar3 != false) {
      (pmVar12->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_engaged = false;
    }
  }
  else {
    (pmVar12->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.super_Displayable.
    _vptr_Displayable = (_func_int **)&PTR_display_001ee058;
    (pmVar12->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id = uVar25;
    (pmVar12->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_engaged = true;
  }
  (pmVar12->jump).bb_true = local_2b8._0_4_;
  (pmVar12->jump).bb_false = local_1e8._0_4_;
  (pmVar12->jump).jump_kind = JVar7;
  return;
}

Assistant:

void cast_block(mir::inst::BasicBlk& blk) {
    auto new_id = label_cast_map.at(blk.id);
    func.basic_blks.insert(std::make_pair(new_id, mir::inst::BasicBlk(new_id)));
    auto& new_blk = func.basic_blks.at(new_id);
    for (auto pre : blk.preceding) {
      auto new_pre = label_cast_map.at(pre);
      if (new_pre == sub_starttId) {
        new_pre = cur_blkId;
      }
      new_blk.preceding.insert(new_pre);
    }

    for (auto& inst : blk.inst) {
      auto kind = inst->inst_kind();
      auto& i = *inst;
      switch (kind) {
        case mir::inst::InstKind::Ref: {
          auto refInst = dynamic_cast<mir::inst::RefInst*>(&i);
          auto val = refInst->val;
          std::variant<mir::inst::VarId, std::string> _val;
          if (val.index() == 0) {
            _val = mir::inst::VarId(
                var_cast_map.at(std::get<mir::inst::VarId>(val).id));
          } else {
            _val = std::get<std::string>(val);
          }
          new_blk.inst.push_back(std::make_unique<mir::inst::RefInst>(
              cast_varId(refInst->dest), _val));
          break;
        }
        case mir::inst::InstKind::Op: {
          auto opInst = dynamic_cast<mir::inst::OpInst*>(&i);
          new_blk.inst.push_back(std::make_unique<mir::inst::OpInst>(
              cast_varId(opInst->dest), cast_value(opInst->lhs),
              cast_value(opInst->rhs), opInst->op));
          break;
        }
        case mir::inst::InstKind::Assign: {
          auto assignInst = dynamic_cast<mir::inst::AssignInst*>(&i);
          new_blk.inst.push_back(std::make_unique<mir::inst::AssignInst>(
              cast_varId(assignInst->dest), cast_value(assignInst->src)));
          break;
        }
        case mir::inst::InstKind::Load: {
          auto loadInst = dynamic_cast<mir::inst::LoadInst*>(&i);
          new_blk.inst.push_back(std::make_unique<mir::inst::LoadInst>(
              cast_value(loadInst->src), cast_varId(loadInst->dest)));
          break;
        }
        case mir::inst::InstKind::Store: {
          auto storeInst = dynamic_cast<mir::inst::StoreInst*>(&i);
          new_blk.inst.push_back(std::make_unique<mir::inst::StoreInst>(
              cast_value(storeInst->val), cast_varId(storeInst->dest)));
          break;
        }
        case mir::inst::InstKind::Call: {
          auto callInst = dynamic_cast<mir::inst::CallInst*>(&i);
          std::vector<mir::inst::Value> paras;
          for (auto val : callInst->params) {
            paras.push_back(cast_value(val));
          }
          new_blk.inst.push_back(std::make_unique<mir::inst::CallInst>(
              cast_varId(callInst->dest), callInst->func, paras));
          break;
        }
        case mir::inst::InstKind::PtrOffset: {
          auto ptrInst = dynamic_cast<mir::inst::PtrOffsetInst*>(&i);
          new_blk.inst.push_back(std::make_unique<mir::inst::PtrOffsetInst>(
              cast_varId(ptrInst->dest), cast_varId(ptrInst->ptr),
              cast_value(ptrInst->offset)));
          break;
        }
        case mir::inst::InstKind::Phi: {
          auto phiInst = dynamic_cast<mir::inst::PhiInst*>(&i);
          std::vector<mir::inst::VarId> vars;
          for (auto vaR : phiInst->vars) {
            vars.push_back(cast_varId(vaR));
          }
          new_blk.inst.push_back(std::make_unique<mir::inst::PhiInst>(
              cast_varId(phiInst->dest), vars));
          break;
        }

        default:
          LOG(TRACE) << "error!" << std::endl;
      }
    }

    std::optional<mir::inst::VarId> cond_or_ret = {};
    auto bb_true = blk.jump.bb_true;
    auto bb_false = blk.jump.bb_false;
    if (label_cast_map.count(bb_true)) {
      bb_true = label_cast_map.at(bb_true);
      // if (bb_true == sub_endId) {
      //   bb_true = cur_blkId;
      // }
    }

    if (label_cast_map.count(bb_false)) {
      bb_false = label_cast_map.at(bb_false);
      // if (bb_false == sub_endId) {
      //   bb_false = cur_blkId;
      // }
    }

    if (blk.jump.cond_or_ret.has_value()) {
      cond_or_ret = blk.jump.cond_or_ret.value();
      cond_or_ret = mir::inst::VarId(var_cast_map.at(cond_or_ret.value().id));
    }
    new_blk.jump = mir::inst::JumpInstruction(blk.jump.kind, bb_true, bb_false,
                                              cond_or_ret, blk.jump.jump_kind);
  }